

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall
Catch::RunContext::reportExpr
          (RunContext *this,AssertionInfo *info,OfType resultType,ITransientExpression *expr,
          bool negated)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *pcVar3;
  size_type sVar4;
  char *pcVar5;
  size_t sVar6;
  size_type sVar7;
  AssertionResult assertionResult;
  uint7 uStack_ff;
  uint7 uStack_df;
  undefined7 uStack_c7;
  AssertionResult local_b8;
  
  (this->m_lastAssertionInfo).resultDisposition = info->resultDisposition;
  pcVar3 = (info->macroName).m_start;
  sVar4 = (info->macroName).m_size;
  pcVar5 = (info->lineInfo).file;
  sVar6 = (info->lineInfo).line;
  sVar7 = (info->capturedExpression).m_size;
  (this->m_lastAssertionInfo).capturedExpression.m_start = (info->capturedExpression).m_start;
  (this->m_lastAssertionInfo).capturedExpression.m_size = sVar7;
  (this->m_lastAssertionInfo).lineInfo.file = pcVar5;
  (this->m_lastAssertionInfo).lineInfo.line = sVar6;
  (this->m_lastAssertionInfo).macroName.m_start = pcVar3;
  (this->m_lastAssertionInfo).macroName.m_size = sVar4;
  local_b8.m_info.resultDisposition = info->resultDisposition;
  local_b8.m_info._52_4_ = *(undefined4 *)&info->field_0x34;
  paVar1 = &local_b8.m_resultData.message.field_2;
  local_b8.m_info.macroName.m_start = (info->macroName).m_start;
  local_b8.m_info.macroName.m_size = (info->macroName).m_size;
  local_b8.m_info.lineInfo.file = (info->lineInfo).file;
  local_b8.m_info.lineInfo.line = (info->lineInfo).line;
  local_b8.m_info.capturedExpression.m_start = (info->capturedExpression).m_start;
  local_b8.m_info.capturedExpression.m_size = (info->capturedExpression).m_size;
  local_b8.m_resultData.message.field_2._M_allocated_capacity = (ulong)uStack_ff << 8;
  local_b8.m_resultData.message._M_string_length = 0;
  paVar2 = &local_b8.m_resultData.reconstructedExpression.field_2;
  local_b8.m_resultData.reconstructedExpression.field_2._M_allocated_capacity =
       (ulong)uStack_df << 8;
  local_b8.m_resultData.reconstructedExpression._M_string_length = 0;
  local_b8.m_resultData.lazyExpression._9_7_ = uStack_c7;
  local_b8.m_resultData.lazyExpression.m_isNegated = negated;
  local_b8.m_resultData.message._M_dataplus._M_p = (pointer)paVar1;
  local_b8.m_resultData.reconstructedExpression._M_dataplus._M_p = (pointer)paVar2;
  local_b8.m_resultData.lazyExpression.m_transientExpression = expr;
  local_b8.m_resultData.resultType = resultType;
  assertionEnded(this,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.m_resultData.reconstructedExpression._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8.m_resultData.reconstructedExpression._M_dataplus._M_p,
                    local_b8.m_resultData.reconstructedExpression.field_2._M_allocated_capacity + 1)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.m_resultData.message._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8.m_resultData.message._M_dataplus._M_p,
                    local_b8.m_resultData.message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void RunContext::reportExpr(
            AssertionInfo const &info,
            ResultWas::OfType resultType,
            ITransientExpression const *expr,
            bool negated ) {

        m_lastAssertionInfo = info;
        AssertionResultData data( resultType, LazyExpression( negated ) );

        AssertionResult assertionResult{ info, CATCH_MOVE( data ) };
        assertionResult.m_resultData.lazyExpression.m_transientExpression = expr;

        assertionEnded( CATCH_MOVE(assertionResult) );
    }